

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O2

bool __thiscall
testing::internal::
CartesianProductGenerator<bool_(*)(unsigned_char_*,_unsigned_char_*,_int,_int,_int,_int,_int),_std::tuple<int,_int>_>
::IteratorImpl<testing::internal::IndexSequence<0UL,_1UL>_>::AtEnd
          (IteratorImpl<testing::internal::IndexSequence<0UL,_1UL>_> *this)

{
  bool bVar1;
  
  bVar1 = ParamIterator<bool_(*)(unsigned_char_*,_unsigned_char_*,_int,_int,_int,_int,_int)>::
          operator==(&(this->current_).
                      super__Tuple_impl<0UL,_testing::internal::ParamIterator<bool_(*)(unsigned_char_*,_unsigned_char_*,_int,_int,_int,_int,_int)>,_testing::internal::ParamIterator<std::tuple<int,_int>_>_>
                      .
                      super__Head_base<0UL,_testing::internal::ParamIterator<bool_(*)(unsigned_char_*,_unsigned_char_*,_int,_int,_int,_int,_int)>,_false>
                      ._M_head_impl,
                     &(this->end_).
                      super__Tuple_impl<0UL,_testing::internal::ParamIterator<bool_(*)(unsigned_char_*,_unsigned_char_*,_int,_int,_int,_int,_int)>,_testing::internal::ParamIterator<std::tuple<int,_int>_>_>
                      .
                      super__Head_base<0UL,_testing::internal::ParamIterator<bool_(*)(unsigned_char_*,_unsigned_char_*,_int,_int,_int,_int,_int)>,_false>
                      ._M_head_impl);
  if (bVar1) {
    return true;
  }
  bVar1 = ParamIterator<std::tuple<int,_int>_>::operator==
                    ((ParamIterator<std::tuple<int,_int>_> *)&this->current_,
                     (ParamIterator<std::tuple<int,_int>_> *)&this->end_);
  return bVar1;
}

Assistant:

bool AtEnd() const {
      bool at_end = false;
      bool dummy[] = {
          (at_end = at_end || std::get<I>(current_) == std::get<I>(end_))...};
      (void)dummy;
      return at_end;
    }